

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double __x;
  double dVar1;
  double __val;
  Variable x;
  UnaryExpression local_d8;
  Variable local_c0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_c0);
  (local_c0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  Kandinsky::cos<Kandinsky::Variable,_nullptr>((CosineExpression *)&local_d8,&local_c0);
  (**(local_d8.m_arg.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_BaseExpression)();
  dVar1 = cos(__x);
  (**((local_c0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_88,__val);
  std::operator+(&local_68,"cos(",&local_88);
  std::operator+(&local_48,&local_68,") != ");
  std::__cxx11::to_string(&local_a8,-0.9899924966004454);
  std::operator+(&local_28,&local_48,&local_a8);
  Kandinsky::assertOrExit((bool)(-(dVar1 == -0.9899924966004454) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  Kandinsky::UnaryExpression::~UnaryExpression(&local_d8);
  Kandinsky::Variable::~Variable(&local_c0);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(Kandinsky::cos(x).evaluate() == std::cos(3),
            "cos(" + std::to_string(x.evaluate()) + ") != " + std::to_string(std::cos(3)));
    return 0;
}